

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  Option *pOVar2;
  App *pAVar3;
  size_type sVar4;
  reference pvVar5;
  ostream *poVar6;
  ParseError *e;
  string local_588;
  allocator local_561;
  string local_560;
  allocator local_539;
  string local_538;
  allocator local_511;
  string local_510;
  allocator local_4e9;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  int local_4a0;
  int local_49c;
  int step;
  int max;
  int min;
  allocator local_469;
  string local_468;
  App *local_448;
  Option_group *ogroup;
  string local_438;
  allocator local_411;
  string local_410;
  undefined1 local_3f0 [8];
  vector<int,_std::allocator<int>_> range;
  string local_3d0;
  allocator local_399;
  string local_398;
  undefined1 local_378 [8];
  App app;
  char **argv_local;
  int argc_local;
  
  app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_398,"App to demonstrate exclusionary option groups.",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3d0,"",
             (allocator *)
             ((long)&range.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  CLI::App::App((App *)local_378,&local_398,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&range.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  CLI::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"--range,-R",&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"A range",(allocator *)((long)&ogroup + 7));
  pOVar2 = CLI::App::
           add_option<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_(CLI::detail::enabler)0>
                     ((App *)local_378,&local_410,(vector<int,_std::allocator<int>_> *)local_3f0,
                      &local_438);
  CLI::Option::expected(pOVar2,-2);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ogroup + 7));
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"min_max_step",&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&min,"set the min max and step",(allocator *)((long)&max + 3));
  pAVar3 = &CLI::App::add_option_group<CLI::Option_group>
                      ((App *)local_378,&local_468,(string *)&min)->super_App;
  std::__cxx11::string::~string((string *)&min);
  std::allocator<char>::~allocator((allocator<char> *)((long)&max + 3));
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  step = 0;
  local_49c = 0;
  local_4a0 = 1;
  local_448 = pAVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c0,"--min,-m",&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e8,"The minimum",&local_4e9);
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_4c0,&step,&local_4e8);
  CLI::OptionBase<CLI::Option>::required(&pOVar2->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  pAVar3 = local_448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_510,"--max,-M",&local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_538,"The maximum",&local_539);
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_510,&local_49c,&local_538);
  CLI::OptionBase<CLI::Option>::required(&pOVar2->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  pAVar3 = local_448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_560,"--step,-s",&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_588,"The step",(allocator *)((long)&e + 7));
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_560,&local_4a0,&local_588);
  CLI::Option::capture_default_str(pOVar2);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  CLI::App::require_option((App *)local_378,1);
  CLI::App::parse((App *)local_378,argc,
                  (char **)app.config_formatter_.
                           super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
  bVar1 = CLI::std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)local_3f0);
  if (!bVar1) {
    sVar4 = CLI::std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_3f0);
    if (sVar4 == 2) {
      pvVar5 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_3f0,0);
      step = *pvVar5;
      pvVar5 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_3f0,1);
      local_49c = *pvVar5;
    }
    sVar4 = CLI::std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_3f0);
    if (2 < sVar4) {
      pvVar5 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_3f0,0);
      local_4a0 = *pvVar5;
      pvVar5 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_3f0,1);
      step = *pvVar5;
      pvVar5 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_3f0,2);
      local_49c = *pvVar5;
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"range is [");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,step);
  poVar6 = std::operator<<(poVar6,':');
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_4a0);
  poVar6 = std::operator<<(poVar6,':');
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_49c);
  std::operator<<(poVar6,"]\n");
  CLI::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)local_3f0);
  CLI::App::~App((App *)local_378);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app{"App to demonstrate exclusionary option groups."};

    std::vector<int> range;
    app.add_option("--range,-R", range, "A range")->expected(-2);

    auto *ogroup = app.add_option_group("min_max_step", "set the min max and step");
    int min{0}, max{0}, step{1};
    ogroup->add_option("--min,-m", min, "The minimum")->required();
    ogroup->add_option("--max,-M", max, "The maximum")->required();
    ogroup->add_option("--step,-s", step, "The step")->capture_default_str();

    app.require_option(1);

    CLI11_PARSE(app, argc, argv);

    if(!range.empty()) {
        if(range.size() == 2) {
            min = range[0];
            max = range[1];
        }
        if(range.size() >= 3) {
            step = range[0];
            min = range[1];
            max = range[2];
        }
    }
    std::cout << "range is [" << min << ':' << step << ':' << max << "]\n";
    return 0;
}